

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb.c
# Opt level: O0

void gameboy_update(void *chip,UINT32 samples,DEV_SMPL **outputs)

{
  byte bVar1;
  UINT32 UVar2;
  int iVar3;
  uint local_38;
  UINT32 local_34;
  UINT32 i;
  DEV_SMPL right;
  DEV_SMPL left;
  DEV_SMPL sample;
  gb_sound_t *gb;
  DEV_SMPL **outputs_local;
  UINT32 samples_local;
  void *chip_local;
  
  for (local_38 = 0; local_38 < samples; local_38 = local_38 + 1) {
    local_34 = 0;
    i = 0;
    RC_STEP((RATIO_CNTR *)((long)chip + 0x120));
    UVar2 = RC_GET_VAL((RATIO_CNTR *)((long)chip + 0x120));
    gb_update_state((gb_sound_t *)chip,UVar2);
    RC_MASK((RATIO_CNTR *)((long)chip + 0x120));
    if (((*(byte *)((long)chip + 0x11) & 1) != 0) && (*(char *)((long)chip + 0x3e) == '\0')) {
      UVar2 = (int)*(char *)((long)chip + 0x22) * (int)*(char *)((long)chip + 0x1e);
      if (*(char *)((long)chip + 0xdf) != '\0') {
        i = UVar2;
      }
      if (*(char *)((long)chip + 0xe0) != '\0') {
        local_34 = UVar2;
      }
    }
    if (((*(byte *)((long)chip + 0x45) & 1) != 0) && (*(char *)((long)chip + 0x72) == '\0')) {
      iVar3 = (int)*(char *)((long)chip + 0x56) * (int)*(char *)((long)chip + 0x52);
      if (*(char *)((long)chip + 0xe1) != '\0') {
        i = iVar3 + i;
      }
      if (*(char *)((long)chip + 0xe2) != '\0') {
        local_34 = iVar3 + local_34;
      }
    }
    if (((*(byte *)((long)chip + 0x79) & 1) != 0) && (*(char *)((long)chip + 0xa6) == '\0')) {
      if (*(char *)((long)chip + 0xe3) != '\0') {
        i = (int)*(char *)((long)chip + 0x8a) + i;
      }
      if (*(char *)((long)chip + 0xe4) != '\0') {
        local_34 = (int)*(char *)((long)chip + 0x8a) + local_34;
      }
    }
    if (((*(byte *)((long)chip + 0xad) & 1) != 0) && (*(char *)((long)chip + 0xda) == '\0')) {
      iVar3 = (int)*(char *)((long)chip + 0xbe) * (int)*(char *)((long)chip + 0xba);
      if (*(char *)((long)chip + 0xe5) != '\0') {
        i = iVar3 + i;
      }
      if (*(char *)((long)chip + 0xe6) != '\0') {
        local_34 = iVar3 + local_34;
      }
    }
    bVar1 = *(byte *)((long)chip + 0xde);
    (*outputs)[local_38] = *(byte *)((long)chip + 0xdd) * i * 0x40;
    outputs[1][local_38] = bVar1 * local_34 * 0x40;
  }
  *(byte *)((long)chip + 0x106) =
       *(byte *)((long)chip + 0x106) & 0xf0 | *(byte *)((long)chip + 0x11) & 1 |
       (*(byte *)((long)chip + 0x45) & 1) << 1 | (*(byte *)((long)chip + 0x79) & 1) << 2 |
       (*(byte *)((long)chip + 0xad) & 1) << 3;
  return;
}

Assistant:

static void gameboy_update(void *chip, UINT32 samples, DEV_SMPL **outputs)
{
	gb_sound_t *gb = (gb_sound_t *)chip;
	DEV_SMPL sample, left, right;
	UINT32 i;

	for (i = 0; i < samples; i++)
	{
		left = right = 0;

		RC_STEP(&gb->cycleCntr);
		gb_update_state(gb, RC_GET_VAL(&gb->cycleCntr));
		RC_MASK(&gb->cycleCntr);

		/* Mode 1 - Wave with Envelope and Sweep */
		if (gb->snd_1.on && !gb->snd_1.Muted)
		{
			sample = gb->snd_1.signal * gb->snd_1.envelope_value;

			if (gb->snd_control.mode1_left)
				left += sample;
			if (gb->snd_control.mode1_right)
				right += sample;
		}

		/* Mode 2 - Wave with Envelope */
		if (gb->snd_2.on && !gb->snd_2.Muted)
		{
			sample = gb->snd_2.signal * gb->snd_2.envelope_value;
			if (gb->snd_control.mode2_left)
				left += sample;
			if (gb->snd_control.mode2_right)
				right += sample;
		}

		/* Mode 3 - Wave patterns from WaveRAM */
		if (gb->snd_3.on && !gb->snd_3.Muted)
		{
			sample = gb->snd_3.signal;
			if (gb->snd_control.mode3_left)
				left += sample;
			if (gb->snd_control.mode3_right)
				right += sample;
		}

		/* Mode 4 - Noise with Envelope */
		if (gb->snd_4.on && !gb->snd_4.Muted)
		{
			sample = gb->snd_4.signal * gb->snd_4.envelope_value;
			if (gb->snd_control.mode4_left)
				left += sample;
			if (gb->snd_control.mode4_right)
				right += sample;
		}

		/* Adjust for master volume */
		left *= gb->snd_control.vol_left;
		right *= gb->snd_control.vol_right;

		/* pump up the volume */
		left <<= 6;
		right <<= 6;

		/* Update the buffers */
		outputs[0][i] = left;
		outputs[1][i] = right;
	}

	gb->snd_regs[NR52] = (gb->snd_regs[NR52]&0xf0) | gb->snd_1.on | (gb->snd_2.on << 1) | (gb->snd_3.on << 2) | (gb->snd_4.on << 3);
}